

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

cf_bool_t cf_memchk_deinit_and_summary(void)

{
  undefined8 *puVar1;
  bool bVar2;
  malloc_info *info;
  cf_hashtbl_iter_t it;
  cf_bool_t is_success;
  
  bVar2 = g_memchk_ctx.alloc_size == 0;
  if (bVar2 == 0) {
    printf("[memchk][leak] has leaks, leak size: %ud\n",g_memchk_ctx.alloc_size & 0xffffffff);
  }
  else {
    printf("[memchk][leak] No leaks!\n");
  }
  for (info = (malloc_info *)cf_hashtbl_iter_init(g_memchk_ctx.alloc_info);
      info != (malloc_info *)0x0;
      info = (malloc_info *)cf_hashtbl_iter_next((cf_hashtbl_iter_t)info)) {
    puVar1 = (undefined8 *)cf_hashtbl_iter_value((cf_hashtbl_iter_t)info);
    if (puVar1 != (undefined8 *)0x0) {
      printf("[%s@%d : %s] leak: %udbytes, stack: %s\n",*puVar1,(ulong)*(uint *)(puVar1 + 2),
             puVar1[1],puVar1[3] & 0xffffffff,puVar1 + 4);
    }
  }
  cf_hashtbl_delete(g_memchk_ctx.alloc_info);
  cf_mutex_destroy(&g_memchk_ctx.mutex);
  cf_membzero(&g_memchk_ctx,0x40);
  return (uint)bVar2;
}

Assistant:

cf_bool_t cf_memchk_deinit_and_summary() {
    cf_bool_t is_success = CF_TRUE;
#ifdef CF_MEMORY_DBG
    cf_hashtbl_iter_t it;
    malloc_info* info;
    is_success = (g_memchk_ctx.alloc_size == 0);
    if (is_success) {
        printf("[memchk][leak] No leaks!\n");
    } else {
        printf("[memchk][leak] has leaks, leak size: %ud\n", (cf_uint32_t)g_memchk_ctx.alloc_size);
    }

    for (it = cf_hashtbl_iter_init(g_memchk_ctx.alloc_info);
        !cf_hashtbl_iter_end(it);
        it = cf_hashtbl_iter_next(it)) {
        info = cf_hashtbl_iter_value(it);
        if (info != CF_NULL_PTR) {
            printf("[%s@%d : %s] leak: %udbytes, stack: %s\n", info->location.file_name,
                info->location.line_number, info->location.function_name, (cf_uint32_t)info->size,
                info->info);
        }
    }
    
    cf_hashtbl_delete(g_memchk_ctx.alloc_info);
    cf_mutex_destroy(&g_memchk_ctx.mutex);
    cf_membzero(&g_memchk_ctx, sizeof(g_memchk_ctx));
#endif
    return is_success;
}